

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O0

uint32_t __thiscall Bitvec08x16::MinPosGreaterThanOrEqual(Bitvec08x16 *this,uint16_t min_val)

{
  undefined1 auVar1 [16];
  uint16_t min_val_local;
  Bitvec08x16 *this_local;
  uint32_t local_58;
  
  auVar1 = vpinsrw_avx(ZEXT216(min_val),(uint)min_val,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)min_val,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)min_val,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)min_val,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)min_val,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)min_val,6);
  auVar1 = vpinsrw_avx(auVar1,(uint)min_val,7);
  auVar1 = vpsubw_avx(*(undefined1 (*) [16])this->vec,auVar1);
  auVar1 = vphminposuw_avx(auVar1);
  local_58 = auVar1._0_4_;
  return local_58;
}

Assistant:

inline uint32_t MinPosGreaterThanOrEqual(uint16_t min_val) {
#ifdef __SSE4_1__
        return _mm_cvtsi128_si32(_mm_minpos_epu16(_mm_sub_epi16(vec, _mm_set1_epi16(min_val))));
#else
        uint32_t min = 0xffff;
        uint32_t pos = 0;
        uint64_t lo = _mm_cvtsi128_si64(vec);
        for (int i = 0; i < 4; i++) {
            uint32_t val = ((int32_t)(lo & 0xffffu) - min_val);
            if (val < min) {
                min = val;
                pos = i;
            }
            lo >>= 16u;
        }
        uint64_t hi = _mm_cvtsi128_si64(_mm_unpackhi_epi64(vec, vec));
        for (int i = 4; i < 8; i++) {
            uint32_t val = ((int32_t)(hi & 0xffffu) - min_val);
            if (val < min) {
                min = val;
                pos = i;
            }
            hi >>= 16u;
        }
        return (pos << 16u) | min;
#endif
    }